

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O2

void __thiscall
pbrt::NanoVDBMediumProvider::NanoVDBMediumProvider
          (NanoVDBMediumProvider *this,Bounds3f *bounds,GridHandle<pbrt::NanoVDBBuffer> *dg,
          GridHandle<pbrt::NanoVDBBuffer> *tg,Float LeScale,Float temperatureCutoff,
          Float temperatureScale)

{
  FloatGrid *pFVar1;
  undefined8 uVar2;
  float fVar3;
  int iVar4;
  undefined4 extraout_var;
  FloatGrid *pFVar5;
  Float maxTemperature;
  float local_24;
  
  fVar3 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar3;
  fVar3 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar2 = *(undefined8 *)&(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar2;
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle(&this->densityGrid,dg);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle(&this->temperatureGrid,tg);
  this->densityFloatGrid = (FloatGrid *)0x0;
  this->temperatureFloatGrid = (FloatGrid *)0x0;
  this->LeScale = LeScale;
  this->temperatureCutoff = temperatureCutoff;
  this->temperatureScale = temperatureScale;
  pFVar1 = (FloatGrid *)(this->densityGrid).mBuffer.ptr;
  pFVar5 = (FloatGrid *)0x0;
  if ((pFVar1 != (FloatGrid *)0x0) && ((pFVar1->super_GridData).mGridType == Float)) {
    pFVar5 = pFVar1;
  }
  this->densityFloatGrid = pFVar5;
  iVar4 = (*(this->temperatureGrid).super_GridHandleBase._vptr_GridHandleBase[2])();
  if (CONCAT44(extraout_var,iVar4) != 0) {
    pFVar1 = (FloatGrid *)(this->temperatureGrid).mBuffer.ptr;
    pFVar5 = (FloatGrid *)0x0;
    if ((pFVar1->super_GridData).mGridType == Float) {
      pFVar5 = pFVar1;
    }
    this->temperatureFloatGrid = pFVar5;
    local_24 = *(float *)(pFVar5[1].super_GridData.mGridName +
                         pFVar5[1].super_GridData.mGridSize + 0xc);
    if (LOGGING_LogLevel < 1) {
      Log<float&>(Verbose,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media.h"
                  ,0x247,"Max temperature: %f",&local_24);
    }
  }
  return;
}

Assistant:

NanoVDBMediumProvider(const Bounds3f &bounds, nanovdb::GridHandle<NanoVDBBuffer> dg,
                          nanovdb::GridHandle<NanoVDBBuffer> tg, Float LeScale,
                          Float temperatureCutoff, Float temperatureScale)
        : bounds(bounds),
          densityGrid(std::move(dg)),
          temperatureGrid(std::move(tg)),
          LeScale(LeScale),
          temperatureCutoff(temperatureCutoff),
          temperatureScale(temperatureScale) {
        densityFloatGrid = densityGrid.grid<float>();
        if (temperatureGrid) {
            temperatureFloatGrid = temperatureGrid.grid<float>();
            Float minTemperature, maxTemperature;
            temperatureFloatGrid->tree().extrema(minTemperature, maxTemperature);
            LOG_VERBOSE("Max temperature: %f", maxTemperature);
        }
    }